

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void alloc_compound_type_rd_buffers(aom_internal_error_info *error,CompoundTypeRdBuffers *bufs)

{
  void *pvVar1;
  long *in_RSI;
  aom_internal_error_info *in_RDI;
  size_t unaff_retaddr;
  
  pvVar1 = aom_memalign((size_t)bufs,unaff_retaddr);
  *in_RSI = (long)pvVar1;
  if (*in_RSI == 0) {
    aom_internal_error(in_RDI,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->pred0");
  }
  pvVar1 = aom_memalign((size_t)bufs,unaff_retaddr);
  in_RSI[1] = (long)pvVar1;
  if (in_RSI[1] == 0) {
    aom_internal_error(in_RDI,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->pred1");
  }
  pvVar1 = aom_memalign((size_t)bufs,unaff_retaddr);
  in_RSI[2] = (long)pvVar1;
  if (in_RSI[2] == 0) {
    aom_internal_error(in_RDI,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->residual1");
  }
  pvVar1 = aom_memalign((size_t)bufs,unaff_retaddr);
  in_RSI[3] = (long)pvVar1;
  if (in_RSI[3] == 0) {
    aom_internal_error(in_RDI,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->diff10");
  }
  pvVar1 = aom_malloc(0x12af972);
  in_RSI[4] = (long)pvVar1;
  if (in_RSI[4] == 0) {
    aom_internal_error(in_RDI,AOM_CODEC_MEM_ERROR,"Failed to allocate bufs->tmp_best_mask_buf");
  }
  return;
}

Assistant:

static inline void alloc_compound_type_rd_buffers(
    struct aom_internal_error_info *error, CompoundTypeRdBuffers *const bufs) {
  AOM_CHECK_MEM_ERROR(
      error, bufs->pred0,
      (uint8_t *)aom_memalign(16, 2 * MAX_SB_SQUARE * sizeof(*bufs->pred0)));
  AOM_CHECK_MEM_ERROR(
      error, bufs->pred1,
      (uint8_t *)aom_memalign(16, 2 * MAX_SB_SQUARE * sizeof(*bufs->pred1)));
  AOM_CHECK_MEM_ERROR(
      error, bufs->residual1,
      (int16_t *)aom_memalign(32, MAX_SB_SQUARE * sizeof(*bufs->residual1)));
  AOM_CHECK_MEM_ERROR(
      error, bufs->diff10,
      (int16_t *)aom_memalign(32, MAX_SB_SQUARE * sizeof(*bufs->diff10)));
  AOM_CHECK_MEM_ERROR(error, bufs->tmp_best_mask_buf,
                      (uint8_t *)aom_malloc(2 * MAX_SB_SQUARE *
                                            sizeof(*bufs->tmp_best_mask_buf)));
}